

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_overload_function(sqlite3 *db,char *zName,int nArg)

{
  int iVar1;
  int rc;
  FuncDef *pFVar2;
  
  iVar1 = sqlite3Strlen30(zName);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  rc = 0;
  pFVar2 = sqlite3FindFunction(db,zName,iVar1,nArg,'\x01','\0');
  if (pFVar2 == (FuncDef *)0x0) {
    rc = sqlite3CreateFunc(db,zName,nArg,1,(void *)0x0,sqlite3InvalidFunction,
                           (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                           (_func_void_sqlite3_context_ptr *)0x0,(FuncDestructor *)0x0);
  }
  iVar1 = sqlite3ApiExit(db,rc);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_overload_function(
  sqlite3 *db,
  const char *zName,
  int nArg
){
  int nName = sqlite3Strlen30(zName);
  int rc = SQLITE_OK;
  sqlite3_mutex_enter(db->mutex);
  if( sqlite3FindFunction(db, zName, nName, nArg, SQLITE_UTF8, 0)==0 ){
    rc = sqlite3CreateFunc(db, zName, nArg, SQLITE_UTF8,
                           0, sqlite3InvalidFunction, 0, 0, 0);
  }
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}